

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O1

char * sha256_End(SHA256_CTX *context,char *buffer)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  sha2_byte digest [32];
  byte local_28 [32];
  
  if (buffer == (char *)0x0) {
    memzero(context,0x68);
    pcVar4 = (char *)0x0;
  }
  else {
    sha256_Final(context,local_28);
    lVar2 = 0;
    lVar3 = 0;
    do {
      bVar1 = local_28[lVar3];
      buffer[lVar3 * 2] = "0123456789abcdef"[bVar1 >> 4];
      buffer[lVar3 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + -2;
    } while (lVar3 != 0x20);
    buffer[0x40] = '\0';
    pcVar4 = buffer + -lVar2;
  }
  memzero(local_28,0x20);
  return pcVar4;
}

Assistant:

char *sha256_End(trezor::SHA256_CTX* context, char buffer[]) {
	sha2_byte	digest[SHA256_DIGEST_LENGTH], *d = digest;
	int		i;

	if (buffer != (char*)0) {
		sha256_Final(context, digest);

		for (i = 0; i < SHA256_DIGEST_LENGTH; i++) {
			*buffer++ = sha2_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha2_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		memzero(context, sizeof(trezor::SHA256_CTX));
	}
	memzero(digest, SHA256_DIGEST_LENGTH);
	return buffer;
}